

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serverbrowser.cpp
# Opt level: O2

CServerEntry * __thiscall
CServerBrowser::Find(CServerBrowser *this,int ServerlistType,NETADDR *Addr)

{
  CServerEntry *a;
  int iVar1;
  CServerEntry **ppCVar2;
  
  iVar1 = AddrHash(Addr);
  ppCVar2 = this->m_aServerlist[ServerlistType].m_aServerlistIp + iVar1;
  while( true ) {
    a = *ppCVar2;
    if (a == (CServerEntry *)0x0) {
      return (CServerEntry *)0x0;
    }
    iVar1 = net_addr_comp(&a->m_Addr,Addr,1);
    if (iVar1 == 0) break;
    ppCVar2 = &a->m_pNextIp;
  }
  return a;
}

Assistant:

CServerEntry *CServerBrowser::Find(int ServerlistType, const NETADDR &Addr)
{
	for(CServerEntry *pEntry = m_aServerlist[ServerlistType].m_aServerlistIp[AddrHash(&Addr)]; pEntry; pEntry = pEntry->m_pNextIp)
	{
		if(net_addr_comp(&pEntry->m_Addr, &Addr, true) == 0)
			return pEntry;
	}
	return (CServerEntry*)0;
}